

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

size_t __thiscall llvm::StringRef::rfind(StringRef *this,char C,size_t From)

{
  long lVar1;
  ulong uVar2;
  
  if (this->Length < From) {
    From = this->Length;
  }
  do {
    uVar2 = From - 1;
    if (From == 0) {
      return 0xffffffffffffffff;
    }
    lVar1 = From - 1;
    From = uVar2;
  } while (this->Data[lVar1] != C);
  return uVar2;
}

Assistant:

LLVM_NODISCARD
    size_t rfind(char C, size_t From = npos) const {
      From = std::min(From, Length);
      size_t i = From;
      while (i != 0) {
        --i;
        if (Data[i] == C)
          return i;
      }
      return npos;
    }